

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::SPxMainSM<double>::DoubletonEquationPS::execute
          (DoubletonEquationPS *this,VectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *param_3,VectorBase<double> *r,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  char cVar1;
  VarStatus VVar2;
  int iVar3;
  Nonzero<double> *pNVar4;
  pointer pdVar5;
  long lVar6;
  long lVar7;
  double dVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar9;
  
  VVar2 = cStatus->data[this->m_k];
  if (VVar2 == ON_UPPER) {
    cVar1 = this->m_strictUp;
  }
  else if (VVar2 == FIXED) {
    if (this->m_maxSense != true) {
      dVar9 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[this->m_j];
      if ((dVar9 <= 0.0) || (this->m_strictLo == false)) {
        if (0.0 <= dVar9) {
          return;
        }
        if (this->m_strictUp != true) {
          return;
        }
      }
      goto LAB_001fd887;
    }
    dVar9 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[this->m_j];
    if ((0.0 < dVar9) && (this->m_strictUp != false)) goto LAB_001fd887;
    if (0.0 <= dVar9) {
      return;
    }
    cVar1 = this->m_strictLo;
  }
  else {
    if (VVar2 != ON_LOWER) {
      return;
    }
    cVar1 = this->m_strictLo;
  }
  if (cVar1 == '\0') {
    return;
  }
LAB_001fd887:
  dVar9 = this->m_kObj;
  dVar8 = SVectorBase<double>::operator[](&(this->m_col).super_SVectorBase<double>,this->m_i);
  lVar6 = (long)(this->m_col).super_SVectorBase<double>.memused;
  if (0 < lVar6) {
    pNVar4 = (this->m_col).super_SVectorBase<double>.m_elem;
    lVar7 = 0;
    do {
      iVar3 = *(int *)((long)&pNVar4->idx + lVar7);
      if (iVar3 != this->m_i) {
        dVar9 = dVar9 - *(double *)((long)&pNVar4->val + lVar7) *
                        (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar3];
      }
      lVar7 = lVar7 + 0x10;
    } while (lVar6 * 0x10 != lVar7);
  }
  (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[this->m_i] = dVar9 / dVar8;
  pdVar5 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5[this->m_k] = 0.0;
  dVar9 = this->m_jObj - (dVar9 * this->m_aij) / dVar8;
  iVar3 = this->m_j;
  pdVar5[iVar3] = dVar9;
  if (this->m_jFixed == false) {
    (*(this->super_PostStep)._vptr_PostStep[7])(this);
    if ((extraout_XMM0_Qa < dVar9) ||
       ((dVar9 = (r->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_j],
        (*(this->super_PostStep)._vptr_PostStep[7])(this), ABS(dVar9) <= extraout_XMM0_Qa_00 &&
        (dVar9 = (x->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[this->m_j], dVar8 = this->m_Lo_j,
        (*(this->super_PostStep)._vptr_PostStep[7])(this), ABS(dVar9 - dVar8) <= extraout_XMM0_Qa_01
        )))) {
      cStatus->data[this->m_j] = ON_LOWER;
    }
    else {
      cStatus->data[this->m_j] = ON_UPPER;
    }
  }
  else {
    cStatus->data[iVar3] = FIXED;
  }
  cStatus->data[this->m_k] = BASIC;
  return;
}

Assistant:

void SPxMainSM<R>::DoubletonEquationPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>&,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // dual:
   if((cStatus[m_k]  != SPxSolverBase<R>::BASIC) &&
         ((cStatus[m_k] == SPxSolverBase<R>::ON_LOWER && m_strictLo) ||
          (cStatus[m_k] == SPxSolverBase<R>::ON_UPPER && m_strictUp) ||
          (cStatus[m_k] == SPxSolverBase<R>::FIXED    &&
           ((m_maxSense && ((r[m_j] > 0 && m_strictUp) || (r[m_j] < 0 && m_strictLo))) ||
            (!m_maxSense && ((r[m_j] > 0 && m_strictLo) || (r[m_j] < 0 && m_strictUp)))))))
   {
      R val  = m_kObj;
      R aik  = m_col[m_i];

      for(int _k = 0; _k < m_col.size(); ++_k)
      {
         if(m_col.index(_k) != m_i)
            val -= m_col.value(_k) * y[m_col.index(_k)];
      }

      y[m_i] = val / aik;
      r[m_k] = 0.0;

      r[m_j] = m_jObj - val * m_aij / aik;

      SOPLEX_ASSERT_WARN("WMAISM73", isNotZero(m_aij * aik, this->epsilon()));

      // basis:
      if(m_jFixed)
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      else
      {
         if(GT(r[m_j], (R) 0, this->epsilon()) || (isZero(r[m_j], this->epsilon())
               && EQ(x[m_j], m_Lo_j, this->epsilon())))
            cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
         else
            cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }

      cStatus[m_k] = SPxSolverBase<R>::BASIC;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM23 Dimension doesn't match after this step.");
   }

#endif
}